

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O0

size_t bitset_extract_intersection_setbits_uint16
                 (uint64_t *words1,uint64_t *words2,size_t length,uint16_t *out,uint16_t base)

{
  int iVar1;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  short in_R8W;
  int r;
  uint64_t w;
  size_t i;
  int outpos;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined2 local_22;
  
  local_28 = 0;
  local_22 = in_R8W;
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    for (local_38 = *(ulong *)(in_RDI + local_30 * 8) & *(ulong *)(in_RSI + local_30 * 8);
        local_38 != 0; local_38 = local_38 - 1 & local_38) {
      iVar1 = roaring_trailing_zeroes(local_38);
      *(short *)(in_RCX + (long)local_28 * 2) = (short)iVar1 + local_22;
      local_28 = local_28 + 1;
    }
    local_22 = local_22 + 0x40;
  }
  return (long)local_28;
}

Assistant:

size_t bitset_extract_intersection_setbits_uint16(
    const uint64_t *__restrict__ words1, const uint64_t *__restrict__ words2,
    size_t length, uint16_t *out, uint16_t base) {
    int outpos = 0;
    for (size_t i = 0; i < length; ++i) {
        uint64_t w = words1[i] & words2[i];
        while (w != 0) {
            int r = roaring_trailing_zeroes(w);
            out[outpos++] = (uint16_t)(r + base);
            w &= (w - 1);
        }
        base += 64;
    }
    return outpos;
}